

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_charRefNumber(ENCODING *UNUSED_enc,char *ptr)

{
  byte bVar1;
  int c;
  int iVar2;
  byte *pbVar3;
  uint result;
  
  bVar1 = ptr[2];
  pbVar3 = (byte *)(ptr + 3);
  result = 0;
  if (bVar1 == 0x78) {
    do {
      bVar1 = *pbVar3;
      if (bVar1 - 0x30 < 0x37) {
        iVar2 = (int)(char)bVar1;
        switch((uint)bVar1) {
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          result = result << 4 | iVar2 - 0x30U;
          break;
        default:
          goto switchD_0038ce61_caseD_3a;
        case 0x3b:
          goto switchD_0038ce61_caseD_3b;
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x46:
          result = (result * 0x10 + iVar2) - 0x37;
          break;
        case 0x61:
        case 0x62:
        case 99:
        case 100:
        case 0x65:
        case 0x66:
          result = (result * 0x10 + iVar2) - 0x57;
        }
        if (0x10ffff < (int)result) {
          return -1;
        }
      }
switchD_0038ce61_caseD_3a:
      pbVar3 = pbVar3 + 1;
    } while( true );
  }
  while (bVar1 != 0x3b) {
    result = ((int)(char)bVar1 + result * 10) - 0x30;
    if (0x10ffff < (int)result) {
      return -1;
    }
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
  }
switchD_0038ce61_caseD_3b:
  iVar2 = checkCharRefNumber(result);
  return iVar2;
}

Assistant:

PREFIX(charRefNumber)(const ENCODING *UNUSED_P(enc), const char *ptr)
{
  int result = 0;
  /* skip &# */
  ptr += 2*MINBPC(enc);
  if (CHAR_MATCHES(enc, ptr, ASCII_x)) {
    for (ptr += MINBPC(enc);
         !CHAR_MATCHES(enc, ptr, ASCII_SEMI);
         ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      switch (c) {
      case ASCII_0: case ASCII_1: case ASCII_2: case ASCII_3: case ASCII_4:
      case ASCII_5: case ASCII_6: case ASCII_7: case ASCII_8: case ASCII_9:
        result <<= 4;
        result |= (c - ASCII_0);
        break;
      case ASCII_A: case ASCII_B: case ASCII_C:
      case ASCII_D: case ASCII_E: case ASCII_F:
        result <<= 4;
        result += 10 + (c - ASCII_A);
        break;
      case ASCII_a: case ASCII_b: case ASCII_c:
      case ASCII_d: case ASCII_e: case ASCII_f:
        result <<= 4;
        result += 10 + (c - ASCII_a);
        break;
      }
      if (result >= 0x110000)
        return -1;
    }
  }
  else {
    for (; !CHAR_MATCHES(enc, ptr, ASCII_SEMI); ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      result *= 10;
      result += (c - ASCII_0);
      if (result >= 0x110000)
        return -1;
    }
  }
  return checkCharRefNumber(result);
}